

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

int Abc_NtkRecAddCut3(If_Man_t *pIfMan,If_Obj_t *pRoot,If_Cut_t *pCut)

{
  word *pTruth;
  float fVar1;
  Gia_Man_t *p;
  ulong *puVar2;
  Vec_Mem_t *pVVar3;
  If_Man_t *p_00;
  int v;
  uint uVar4;
  uint uVar5;
  long lVar6;
  word *pwVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  word *pwVar13;
  int SuppSize;
  int iVar14;
  Vec_Ptr_t *pVVar15;
  Lms_Man_t *pLVar16;
  uint *puVar17;
  timespec ts;
  char pCanonPerm [16];
  timespec local_90;
  Lms_Man_t *local_80;
  uint local_74;
  ulong local_70;
  Vec_Ptr_t *local_68;
  long local_60;
  If_Man_t *local_58;
  If_Obj_t *local_50;
  char local_48 [24];
  
  pLVar16 = s_pMan3;
  uVar5 = *(uint *)&pCut->field_0x1c;
  local_68 = s_pMan3->vNodes;
  p = s_pMan3->pGia;
  s_pMan3->nTried = s_pMan3->nTried + 1;
  if (pLVar16->nVars != (*(uint *)&pCut->field_0x1c >> 0x10 & 0xff)) {
    __assert_fail("p->nVars == (int)pCut->nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x2c3,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
  }
  if (uVar5 < 0x2000000) {
LAB_002f91be:
    pLVar16->nFilterSize = pLVar16->nFilterSize + 1;
  }
  else {
    local_70 = (ulong)(uVar5 >> 0x18);
    if (uVar5 >> 0x18 == 2) {
      uVar4 = pCut->iCutFunc;
      if ((int)uVar4 < 0) goto LAB_002f9baa;
      puVar2 = pIfMan->puTempW;
      uVar11 = *(uint *)&pCut->field_0x1c >> 0x18;
      pVVar3 = pIfMan->vTtMem[uVar11];
      if (pVVar3 == (Vec_Mem_t *)0x0) {
        pwVar13 = (word *)0x0;
      }
      else {
        uVar8 = uVar4 >> 1;
        if (pVVar3->nEntries <= (int)uVar8) goto LAB_002f9bc9;
        pwVar13 = pVVar3->ppPages[uVar8 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
                  (ulong)(uVar8 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
      }
      uVar11 = pIfMan->nTruth6Words[uVar11];
      if ((uVar4 & 1) == 0) {
        if (0 < (int)uVar11) {
          uVar12 = 0;
          do {
            puVar2[uVar12] = pwVar13[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
      }
      else if (0 < (int)uVar11) {
        uVar12 = 0;
        do {
          puVar2[uVar12] = ~pwVar13[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      lVar6 = 0;
      pwVar13 = s_Truths6Neg;
      iVar14 = 0;
      do {
        iVar14 = (iVar14 + 1) -
                 (uint)(((*puVar2 >> ((byte)(1 << ((byte)lVar6 & 0x1f)) & 0x3f) ^ *puVar2) &
                        *pwVar13) == 0);
        lVar6 = lVar6 + 1;
        pwVar13 = pwVar13 + 1;
      } while (lVar6 != 2);
      if (iVar14 != 2) goto LAB_002f91be;
    }
    local_80 = pLVar16;
    iVar14 = clock_gettime(3,&local_90);
    pLVar16 = local_80;
    if (iVar14 < 0) {
      local_60 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
      local_60 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_90.tv_sec * -1000000;
    }
    uVar4 = pCut->iCutFunc;
    if ((int)uVar4 < 0) {
LAB_002f9baa:
      __assert_fail("pCut->iCutFunc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                    ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
    }
    pwVar13 = pIfMan->puTempW;
    pVVar3 = pIfMan->vTtMem[(byte)pCut->field_0x1f];
    local_50 = pRoot;
    if (pVVar3 == (Vec_Mem_t *)0x0) {
      pwVar7 = (word *)0x0;
    }
    else {
      uVar11 = uVar4 >> 1;
      if (pVVar3->nEntries <= (int)uVar11) {
LAB_002f9bc9:
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar7 = pVVar3->ppPages[uVar11 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
               (ulong)(uVar11 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
    }
    pTruth = local_80->pTemp1;
    uVar11 = pIfMan->nTruth6Words[(byte)pCut->field_0x1f];
    if ((uVar4 & 1) == 0) {
      if (0 < (int)uVar11) {
        uVar12 = 0;
        do {
          pwVar13[uVar12] = pwVar7[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    else if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        pwVar13[uVar12] = ~pwVar7[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    local_58 = pIfMan;
    memcpy(pTruth,pwVar13,(long)local_80->nWords << 3);
    iVar10 = (int)local_70;
    local_74 = Abc_TtCanonicize(pTruth,iVar10,local_48);
    iVar14 = pLVar16->nVars;
    if (iVar10 != iVar14) {
      if (iVar14 <= iVar10) {
        __assert_fail("nVarS < nVarB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x46e,"void Abc_TtStretch5(unsigned int *, int, int)");
      }
      uVar4 = 1 << ((char)local_70 - 5U & 0x1f);
      if (uVar5 < 0x6000000) {
        uVar4 = 1;
      }
      uVar11 = 1 << ((char)iVar14 - 5U & 0x1f);
      if (iVar14 < 6) {
        uVar11 = 1;
      }
      if (uVar4 != uVar11) {
        if ((int)uVar11 <= (int)uVar4) {
          __assert_fail("step < nWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x473,"void Abc_TtStretch5(unsigned int *, int, int)");
        }
        if (0 < (int)uVar11) {
          lVar6 = 0;
          pwVar13 = pTruth;
          do {
            if (0 < (int)uVar4) {
              uVar12 = 0;
              do {
                *(undefined4 *)((long)pwVar13 + uVar12 * 4) =
                     *(undefined4 *)((long)pTruth + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar4 != uVar12);
            }
            lVar6 = lVar6 + (int)uVar4;
            pwVar13 = (word *)((long)pwVar13 + (long)(int)uVar4 * 4);
          } while (lVar6 < (long)(ulong)uVar11);
        }
      }
    }
    iVar14 = clock_gettime(3,&local_90);
    p_00 = local_58;
    pLVar16 = local_80;
    if (iVar14 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
    }
    local_80->timeCanon = local_80->timeCanon + lVar6 + local_60;
    if (local_80->pGia == (Gia_Man_t *)0x0) {
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      Vec_MemHashInsert(pLVar16->vTtMem,pTruth);
      pLVar16->nAdded = pLVar16->nAdded + 1;
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      lVar9 = lVar9 + lVar6;
    }
    else {
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      If_CutTraverse(p_00,local_50,pCut,local_68);
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      local_80->timeTruth = local_80->timeTruth + lVar9 + lVar6;
      if (0xfd < local_68->nSize) {
        local_80->nFilterSize = local_80->nFilterSize + 1;
        return 1;
      }
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      iVar14 = (int)local_70;
      uVar12 = 0;
      do {
        lVar9 = (long)p->vCis->nSize;
        if (lVar9 - p->nRegs <= (long)uVar12) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        if (lVar9 <= (long)uVar12) goto LAB_002f9b2e;
        iVar10 = p->vCis->pArray[uVar12];
        if ((iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_002f9af0;
        fVar1 = (&pCut[1].Area)[local_48[uVar12]];
        if (((long)(int)fVar1 < 0) || (pVVar15 = p_00->vObjs, pVVar15->nSize <= (int)fVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(uint *)((long)pVVar15->pArray[(int)fVar1] + 0x40) =
             (uint)((local_74 >> ((uint)uVar12 & 0x1f) & 1) != 0) + iVar10 * 2;
        uVar12 = uVar12 + 1;
      } while (iVar14 + (uint)(iVar14 == 0) != uVar12);
      if (local_68->nSize < 1) {
        __assert_fail("Vec_PtrSize(vNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x2fc,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      if (iVar14 < local_68->nSize) {
        uVar12 = (ulong)(uVar5 >> 0x18);
        iVar14 = 0;
        pVVar15 = local_68;
        do {
          puVar17 = (uint *)pVVar15->pArray[uVar12];
          uVar5 = *puVar17;
          uVar4 = 0;
          iVar10 = 1;
          if ((uVar5 & 0xf) != 2) {
            if (((int)*(uint *)(*(long *)(puVar17 + 6) + 0x40) < 0) ||
               ((int)*(uint *)(*(long *)(puVar17 + 8) + 0x40) < 0)) goto LAB_002f9b6c;
            uVar4 = Gia_ManHashAnd(p,*(uint *)(*(long *)(puVar17 + 6) + 0x40) ^ uVar5 >> 4 & 1,
                                   *(uint *)(*(long *)(puVar17 + 8) + 0x40) ^ uVar5 >> 5 & 1);
            pVVar15 = local_68;
            iVar10 = iVar14;
          }
          iVar14 = iVar10;
          puVar17[0x10] = uVar4;
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < pVVar15->nSize);
      }
      else {
        iVar14 = 0;
        puVar17 = (uint *)0x0;
      }
      local_80->nHoleInTheWall = local_80->nHoleInTheWall + iVar14;
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      local_80->timeBuild = local_80->timeBuild + lVar9 + lVar6;
      if ((*puVar17 & 0xf) != 4) {
        __assert_fail("If_ObjIsAnd(pIfObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x30d,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      if ((int)puVar17[0x10] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar5 = puVar17[0x10] >> 1;
      if (p->nObjs <= (int)uVar5) goto LAB_002f9af0;
      uVar12 = *(ulong *)(p->pObjs + uVar5);
      if ((uVar12 >> 0x3e & 1) != 0) {
        local_80->nFilterSame = local_80->nFilterSame + 1;
        return 1;
      }
      *(ulong *)(p->pObjs + uVar5) = uVar12 | 0x4000000000000000;
      if ((int)puVar17[0x10] < 0) {
LAB_002f9b6c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,puVar17[0x10] ^ (uint)((local_74 >> ((uint)local_70 & 0x1f) & 1) != 0));
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      lVar9 = (long)p->vCos->nSize;
      if (lVar9 < 1) {
LAB_002f9b2e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = p->vCos->pArray[lVar9 + -1];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_002f9af0:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pwVar13 = Gia_ObjComputeTruthTable(p,p->pObjs + iVar14);
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      local_80->timeCheck = local_80->timeCheck + lVar9 + lVar6;
      iVar14 = bcmp(pTruth,pwVar13,(long)local_80->nWords << 3);
      pLVar16 = local_80;
      if (iVar14 != 0) {
        lVar6 = (long)p->vCos->nSize;
        if (lVar6 < 1) goto LAB_002f9b2e;
        uVar5 = p->vCos->pArray[lVar6 + -1];
        lVar6 = (long)(int)uVar5;
        if ((-1 < lVar6) && ((int)uVar5 < p->nObjs)) {
          if (uVar5 != 0) {
            *(ulong *)(p->pObjs + lVar6) =
                 *(ulong *)(p->pObjs + lVar6) & 0xffffffffc0000000 | (ulong)(uVar5 & 0x1fffffff);
            Vec_IntPush(local_80->vTruthIds,-1);
            pLVar16->nFilterTruth = pLVar16->nFilterTruth + 1;
            return 1;
          }
          __assert_fail("Gia_ObjId(p, pObjCo) > Abc_Lit2Var(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x36e,"void Gia_ManPatchCoDriver(Gia_Man_t *, int, int)");
        }
        goto LAB_002f9af0;
      }
      iVar14 = clock_gettime(3,&local_90);
      pLVar16 = local_80;
      if (iVar14 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      iVar14 = Vec_MemHashInsert(local_80->vTtMem,pTruth);
      Vec_IntPush(pLVar16->vTruthIds,iVar14);
      if (p->vCos->nSize != pLVar16->vTruthIds->nSize) {
        __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x330,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
      }
      pLVar16->nAdded = pLVar16->nAdded + 1;
      iVar14 = clock_gettime(3,&local_90);
      if (iVar14 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      lVar9 = lVar9 + lVar6;
    }
    pLVar16->timeInsert = pLVar16->timeInsert + lVar9;
  }
  return 1;
}

Assistant:

int Abc_NtkRecAddCut3( If_Man_t * pIfMan, If_Obj_t * pRoot, If_Cut_t * pCut )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int i, Index, iFanin0, iFanin1, fHole;
    int nLeaves = If_CutLeaveNum(pCut);
    Vec_Ptr_t * vNodes = p->vNodes;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pDriver;
    If_Obj_t * pIfObj = NULL;
    word * pTruth;
    abctime clk;
    p->nTried++;

    // skip small cuts
    assert( p->nVars == (int)pCut->nLimit );
    if ( nLeaves < 2 || (nLeaves == 2 && Abc_TtSupportSize(If_CutTruthW(pIfMan, pCut), 2) != 2) )
    {
        p->nFilterSize++;
        return 1;
    }

//    if ( p->vTtMem2 )
//        Vec_MemHashInsert( p->vTtMem2, If_CutTruthW(pCut) );

    // semi-canonicize truth table
clk = Abc_Clock();
    memcpy( p->pTemp1, If_CutTruthW(pIfMan, pCut), p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
    uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
    uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
    Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
    // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth

    if ( p->pGia == NULL )
    {
clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
/*
        if ( p->vTruthFreqs == NULL )
            p->vTruthFreqs = Vec_IntAlloc( 1000 );
        assert( Index <= Vec_IntSize(p->vTruthFreqs)  );
        if ( Index < Vec_IntSize(p->vTruthFreqs) )
            Vec_IntAddToEntry( p->vTruthFreqs, Index, 1 );
        else
            Vec_IntPush( p->vTruthFreqs, 1 );
*/
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
        return 1;
    }

    // collect internal nodes and skip redundant cuts
clk = Abc_Clock();
    If_CutTraverse( pIfMan, pRoot, pCut, vNodes );
p->timeTruth += Abc_Clock() - clk;
    if ( Vec_PtrSize(vNodes) > 253 )
    {
        p->nFilterSize++;
        return 1;
    }

clk = Abc_Clock();
    // map cut leaves into elementary variables of GIA
    for ( i = 0; i < nLeaves; i++ )
        If_ManObj( pIfMan, pCut->pLeaves[(int)pCanonPerm[i]] )->iCopy = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
    // build internal nodes
    fHole = 0;
    assert( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrForEachEntryStart( If_Obj_t *, vNodes, pIfObj, i, nLeaves )
    {
        if ( If_ObjIsCi(pIfObj) )
        {
            pIfObj->iCopy = 0;
            fHole = 1;
            continue;
        }
        iFanin0 = Abc_LitNotCond( If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj) );
        iFanin1 = Abc_LitNotCond( If_ObjFanin1(pIfObj)->iCopy, If_ObjFaninC1(pIfObj) );
        pIfObj->iCopy = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
    }
    p->nHoleInTheWall += fHole;
p->timeBuild += Abc_Clock() - clk;

    // check if this node is already driving a PO
    assert( If_ObjIsAnd(pIfObj) );
    pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pIfObj->iCopy));
    if ( pDriver->fMark1 )
    {
        p->nFilterSame++;
        return 1;
    }
    pDriver->fMark1 = 1;
    // create output
    Gia_ManAppendCo( pGia, Abc_LitNotCond( pIfObj->iCopy, (uCanonPhase >> nLeaves) & 1 ) );

    // verify truth table
clk = Abc_Clock();
    pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
    if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
    {
/*
        Kit_DsdPrintFromTruth( pTruth, nLeaves ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
        printf( "Truth table verification has failed.\n" );
*/
        // drive PO with constant
        Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, -1 );
        p->nFilterTruth++;
        return 1;
    }

clk = Abc_Clock();
    // add the resulting truth table to the hash table 
    Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
    // save truth table ID
    Vec_IntPush( p->vTruthIds, Index );
    assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
    p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    return 1;
}